

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5RenameMethod(sqlite3_vtab *pVtab,char *zName)

{
  Fts5Config *pFVar1;
  int iVar2;
  
  pFVar1 = ((Fts5Storage *)pVtab[1].zErrMsg)->pConfig;
  iVar2 = sqlite3Fts5StorageSync((Fts5Storage *)pVtab[1].zErrMsg);
  if (iVar2 == 0) {
    iVar2 = fts5ExecPrintf(pFVar1->db,(char **)0x0,"ALTER TABLE %Q.\'%q_%s\' RENAME TO \'%q_%s\';",
                           pFVar1->zDb,pFVar1->zName,"data",zName,"data");
  }
  if (iVar2 == 0) {
    iVar2 = fts5ExecPrintf(pFVar1->db,(char **)0x0,"ALTER TABLE %Q.\'%q_%s\' RENAME TO \'%q_%s\';",
                           pFVar1->zDb,pFVar1->zName,"idx",zName,"idx");
  }
  if (iVar2 == 0) {
    iVar2 = fts5ExecPrintf(pFVar1->db,(char **)0x0,"ALTER TABLE %Q.\'%q_%s\' RENAME TO \'%q_%s\';",
                           pFVar1->zDb,pFVar1->zName,"config",zName,"config");
  }
  if ((pFVar1->bColumnsize != 0) && (iVar2 == 0)) {
    iVar2 = fts5ExecPrintf(pFVar1->db,(char **)0x0,"ALTER TABLE %Q.\'%q_%s\' RENAME TO \'%q_%s\';",
                           pFVar1->zDb,pFVar1->zName,"docsize",zName,"docsize");
  }
  if (pFVar1->eContent == 0 && iVar2 == 0) {
    iVar2 = fts5ExecPrintf(pFVar1->db,(char **)0x0,"ALTER TABLE %Q.\'%q_%s\' RENAME TO \'%q_%s\';",
                           pFVar1->zDb,pFVar1->zName,"content",zName,"content");
  }
  return iVar2;
}

Assistant:

static int fts5RenameMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  const char *zName               /* New name of table */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  return sqlite3Fts5StorageRename(pTab->pStorage, zName);
}